

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.h
# Opt level: O0

BigInteger * __thiscall rapidjson::internal::BigInteger::operator*=(BigInteger *this,uint64_t u)

{
  bool bVar1;
  uint64_t uVar2;
  size_t local_38;
  uint64_t hi;
  size_t i;
  uint64_t k;
  uint64_t u_local;
  BigInteger *this_local;
  
  k = u;
  u_local = (uint64_t)this;
  if (u == 0) {
    this_local = operator=(this,0);
  }
  else {
    this_local = this;
    if (u != 1) {
      bVar1 = operator==(this,1);
      if (bVar1) {
        this_local = operator=(this,k);
      }
      else {
        i = 0;
        for (hi = 0; hi < this->count_; hi = hi + 1) {
          uVar2 = MulAdd64(this->digits_[hi],k,i,&local_38);
          this->digits_[hi] = uVar2;
          i = local_38;
        }
        if (i != 0) {
          PushBack(this,i);
        }
      }
    }
  }
  return this_local;
}

Assistant:

BigInteger& operator*=(uint64_t u) {
        if (u == 0) return *this = 0;
        if (u == 1) return *this;
        if (*this == 1) return *this = u;

        uint64_t k = 0;
        for (size_t i = 0; i < count_; i++) {
            uint64_t hi;
            digits_[i] = MulAdd64(digits_[i], u, k, &hi);
            k = hi;
        }
        
        if (k > 0)
            PushBack(k);

        return *this;
    }